

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
     texture_storage_multisample_2d_array(NegativeTestContext *ctx)

{
  ostream *poVar1;
  long lVar2;
  allocator<char> local_1c9;
  string local_1c8;
  ostringstream source;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,
             "GL_OES_texture_storage_multisample_2d_array features require enabling the extension in 310 es shaders."
             ,&local_1c9);
  NegativeTestContext::beginSection(ctx,(string *)&source);
  std::__cxx11::string::~string((string *)&source);
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
    poVar1 = std::operator<<((ostream *)&source,"#version 310 es\n\t");
    poVar1 = std::operator<<(poVar1,(char *)((long)&
                                                  _ZZN4deqp6gles3110Functional18NegativeTestShared12_GLOBAL__N_136texture_storage_multisample_2d_arrayERNS2_19NegativeTestContextEE18s_samplerTypeTests_rel
                                            + (long)*(int *)((long)&
                                                  _ZZN4deqp6gles3110Functional18NegativeTestShared12_GLOBAL__N_136texture_storage_multisample_2d_arrayERNS2_19NegativeTestContextEE18s_samplerTypeTests_rel
                                                  + lVar2)));
    std::operator<<(poVar1,"\nprecision mediump float;\nvoid main()\n{\n}\n");
    std::__cxx11::stringbuf::str();
    verifyShader(ctx,SHADERTYPE_FRAGMENT,&local_1c8,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_storage_multisample_2d_array (NegativeTestContext& ctx)
{
	static const char* const s_samplerTypeTests[] =
	{
		"uniform mediump sampler2DMSArray u_sampler;",
		"uniform mediump isampler2DMSArray u_sampler;",
		"uniform mediump usampler2DMSArray u_sampler;",
	};

	ctx.beginSection("GL_OES_texture_storage_multisample_2d_array features require enabling the extension in 310 es shaders.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_samplerTypeTests); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"	" << s_samplerTypeTests[ndx] << "\n"
					"precision mediump float;\n"
					"void main()\n"
					"{\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
}